

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

ZSTD_parameters *
ZSTD_getParams(int compressionLevel,unsigned_long_long srcSizeHint,size_t dictSize)

{
  ZSTD_parameters *in_RDI;
  ZSTD_parameters *params;
  ZSTD_compressionParameters cParams;
  undefined8 local_34;
  undefined8 local_2c;
  undefined8 local_24;
  ZSTD_strategy local_1c;
  
  ZSTD_getCParams(dictSize._4_4_,cParams._20_8_,cParams._12_8_);
  memset(in_RDI,0,0x28);
  (in_RDI->cParams).windowLog = (undefined4)local_34;
  (in_RDI->cParams).chainLog = local_34._4_4_;
  (in_RDI->cParams).hashLog = (undefined4)local_2c;
  (in_RDI->cParams).searchLog = local_2c._4_4_;
  (in_RDI->cParams).searchLength = (undefined4)local_24;
  (in_RDI->cParams).targetLength = local_24._4_4_;
  (in_RDI->cParams).strategy = local_1c;
  (in_RDI->fParams).contentSizeFlag = 1;
  return in_RDI;
}

Assistant:

ZSTD_parameters ZSTD_getParams(int compressionLevel, unsigned long long srcSizeHint, size_t dictSize) {
    ZSTD_parameters params;
    ZSTD_compressionParameters const cParams = ZSTD_getCParams(compressionLevel, srcSizeHint, dictSize);
    DEBUGLOG(5, "ZSTD_getParams (cLevel=%i)", compressionLevel);
    memset(&params, 0, sizeof(params));
    params.cParams = cParams;
    params.fParams.contentSizeFlag = 1;
    return params;
}